

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  ZSTD_matchState_t *ms;
  seqStore_t *origSeqStore;
  U32 *pUVar1;
  seqStore_t *resultSeqStore;
  seqStore_t *resultSeqStore_00;
  BYTE *iend;
  undefined8 uVar2;
  undefined8 uVar3;
  BYTE BVar4;
  uint uVar5;
  ZSTD_paramSwitch_e ZVar6;
  ZSTD_compressedBlockState_t *pZVar7;
  seqDef *psVar8;
  ushort uVar9;
  short sVar10;
  U32 UVar11;
  int iVar12;
  size_t err_code_8;
  size_t sVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  ushort uVar17;
  uint uVar18;
  uint uVar19;
  size_t sVar20;
  int iVar21;
  uint uVar22;
  size_t err_code_1;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  seqStore_t *psVar27;
  seqStore_t *psVar28;
  size_t err_code;
  ulong uVar29;
  unsigned_long_long uVar30;
  short *dst_00;
  bool bVar31;
  byte bVar32;
  undefined1 auVar33 [16];
  BYTE *local_100;
  repcodes_t dRep;
  undefined4 uStack_d4;
  size_t local_70;
  short *local_68;
  repcodes_t local_60;
  size_t local_50;
  ZSTD_CCtx_params *local_48;
  ZSTD_cwksp *local_40;
  BYTE *local_38;
  
  bVar32 = 0;
  if (cctx->stage == ZSTDcs_created) {
    return 0xffffffffffffffc4;
  }
  if (cctx->stage == ZSTDcs_init && frame != 0) {
    sVar13 = ZSTD_writeFrameHeader
                       (dst,dstCapacity,&cctx->appliedParams,cctx->pledgedSrcSizePlusOne - 1,
                        cctx->dictID);
    if (0xffffffffffffff88 < sVar13) {
      return sVar13;
    }
    bVar31 = dstCapacity < sVar13;
    dstCapacity = dstCapacity - sVar13;
    if (bVar31) {
      __assert_fail("fhSize <= dstCapacity",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x11ed,
                    "size_t ZSTD_compressContinue_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                   );
    }
    dst = (void *)((long)dst + sVar13);
    cctx->stage = ZSTDcs_ongoing;
  }
  else {
    sVar13 = 0;
  }
  if (srcSize == 0) {
    return sVar13;
  }
  ms = &(cctx->blockState).matchState;
  UVar11 = ZSTD_window_update(&ms->window,src,srcSize,
                              (cctx->blockState).matchState.forceNonContiguous);
  if (UVar11 == 0) {
    (cctx->blockState).matchState.forceNonContiguous = 0;
    (cctx->blockState).matchState.nextToUpdate = (cctx->blockState).matchState.window.dictLimit;
  }
  if ((cctx->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
    ZSTD_window_update(&(cctx->ldmState).window,src,srcSize,0);
  }
  if (frame == 0) {
    ZSTD_overflowCorrectIfNeeded
              (ms,&cctx->workspace,&cctx->appliedParams,src,(void *)((long)src + srcSize));
    uVar23 = ZSTD_compressBlock_internal(cctx,dst,dstCapacity,src,srcSize,0);
  }
  else {
    uVar5 = (cctx->appliedParams).cParams.windowLog;
    iVar21 = 1 << ((byte)uVar5 & 0x1f);
    local_50 = sVar13;
    if (0x1f < uVar5) {
      __assert_fail("cctx->appliedParams.cParams.windowLog <= ZSTD_WINDOWLOG_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x1133,
                    "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                   );
    }
    sVar13 = cctx->blockSize;
    if ((cctx->appliedParams).fParams.checksumFlag != 0) {
      ZSTD_XXH64_update(&cctx->xxhState,src,srcSize);
    }
    local_40 = &cctx->workspace;
    origSeqStore = &cctx->seqStore;
    pUVar1 = (cctx->blockSplitCtx).partitions;
    resultSeqStore = &(cctx->blockSplitCtx).nextSeqStore;
    resultSeqStore_00 = &(cctx->blockSplitCtx).currSeqStore;
    dst_00 = (short *)dst;
    local_100 = (BYTE *)src;
    local_48 = &cctx->appliedParams;
    for (sVar20 = srcSize; sVar20 != 0; sVar20 = sVar20 - sVar13) {
      uVar5 = lastFrameChunk & 1;
      if (sVar13 < sVar20) {
        uVar5 = 0;
      }
      if (dstCapacity < 6) {
        return 0xffffffffffffffba;
      }
      if (sVar20 < sVar13) {
        sVar13 = sVar20;
      }
      iend = local_100 + sVar13;
      ZSTD_overflowCorrectIfNeeded(ms,local_40,local_48,local_100,iend);
      iVar12 = (int)(cctx->blockState).matchState.window.base;
      uVar18 = (int)iend - iVar12;
      uVar22 = (cctx->blockState).matchState.loadedDictEnd;
      local_38 = iend;
      if (uVar18 < uVar22) {
        __assert_fail("blockEndIdx >= loadedDictEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x4ba,
                      "void ZSTD_checkDictValidity(const ZSTD_window_t *, const void *, U32, U32 *, const ZSTD_matchState_t **)"
                     );
      }
      if ((uVar22 + iVar21 < uVar18) || (uVar22 != (cctx->blockState).matchState.window.dictLimit))
      {
        (cctx->blockState).matchState.loadedDictEnd = 0;
        (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
        uVar22 = 0;
      }
      uVar19 = (int)local_100 - iVar12;
      uVar18 = (cctx->blockState).matchState.window.lowLimit;
      if (uVar22 + iVar21 < uVar19) {
        uVar19 = uVar19 - iVar21;
        if (uVar18 < uVar19) {
          (cctx->blockState).matchState.window.lowLimit = uVar19;
          uVar18 = uVar19;
        }
        if ((cctx->blockState).matchState.window.dictLimit < uVar18) {
          (cctx->blockState).matchState.window.dictLimit = uVar18;
        }
        (cctx->blockState).matchState.loadedDictEnd = 0;
        (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
      }
      if ((cctx->blockState).matchState.nextToUpdate < uVar18) {
        (cctx->blockState).matchState.nextToUpdate = uVar18;
      }
      uVar9 = (ushort)uVar5;
      sVar10 = (short)sVar13;
      if ((cctx->appliedParams).targetCBlockSize == 0) {
        ZVar6 = (cctx->appliedParams).useBlockSplitter;
        if (ZVar6 == ZSTD_ps_enable) {
          sVar14 = ZSTD_buildSeqStore(cctx,local_100,sVar13);
          if (0xffffffffffffff88 < sVar14) {
            return sVar14;
          }
          if (sVar14 == 1) {
            pZVar7 = (cctx->blockState).prevCBlock;
            if ((pZVar7->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
              (pZVar7->entropy).fse.offcode_repeatMode = FSE_repeat_check;
            }
            uVar15 = sVar13 + 3;
            if (dstCapacity < uVar15) {
              return 0xffffffffffffffba;
            }
            *dst_00 = uVar9 + sVar10 * 8;
            *(char *)(dst_00 + 1) = (char)(sVar13 >> 0xd);
            memcpy((void *)((long)dst_00 + 3),local_100,sVar13);
          }
          else {
            uVar23 = (ulong)((long)(cctx->seqStore).sequences -
                            (long)(cctx->seqStore).sequencesStart) >> 3;
            stack0xffffffffffffff28 = 0;
            uVar22 = (uint)uVar23;
            if (4 < uVar22) {
              dRep.rep._0_8_ = pUVar1;
              ZSTD_deriveBlockSplitsHelper
                        ((seqStoreSplits *)&dRep,0,uVar23 & 0xffffffff,cctx,origSeqStore);
              *(uint *)(dRep.rep._0_8_ + stack0xffffffffffffff28 * 4) = uVar22;
            }
            uVar23 = stack0xffffffffffffff28;
            pZVar7 = (cctx->blockState).prevCBlock;
            stack0xffffffffffffff28 = CONCAT44(uStack_d4,pZVar7->rep[2]);
            dRep.rep._0_8_ = *(undefined8 *)pZVar7->rep;
            local_60.rep._0_8_ = *(undefined8 *)pZVar7->rep;
            local_60.rep[2] = pZVar7->rep[2];
            (cctx->blockSplitCtx).nextSeqStore.maxNbLit = 0;
            (cctx->blockSplitCtx).nextSeqStore.longLengthType = ZSTD_llt_none;
            (cctx->blockSplitCtx).nextSeqStore.longLengthPos = 0;
            (cctx->blockSplitCtx).nextSeqStore.ofCode = (BYTE *)0x0;
            (cctx->blockSplitCtx).nextSeqStore.maxNbSeq = 0;
            (cctx->blockSplitCtx).nextSeqStore.llCode = (BYTE *)0x0;
            (cctx->blockSplitCtx).nextSeqStore.mlCode = (BYTE *)0x0;
            (cctx->blockSplitCtx).nextSeqStore.litStart = (BYTE *)0x0;
            (cctx->blockSplitCtx).nextSeqStore.lit = (BYTE *)0x0;
            resultSeqStore->sequencesStart = (seqDef *)0x0;
            resultSeqStore->sequences = (seqDef *)0x0;
            if (uVar23 == 0) {
              uVar15 = ZSTD_compressSeqStore_singleBlock
                                 (cctx,origSeqStore,&dRep,&local_60,dst_00,dstCapacity,local_100,
                                  sVar13,uVar5,0);
              if (uVar15 < 0xffffffffffffff89) {
                if (0x20000 < cctx->blockSize) {
                  __assert_fail("zc->blockSize <= ZSTD_BLOCKSIZE_MAX",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                                ,0x1034,
                                "size_t ZSTD_compressBlock_splitBlock_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                               );
                }
                if (cctx->blockSize + 3 < uVar15) {
                  __assert_fail("cSizeSingleBlock <= zc->blockSize + ZSTD_blockHeaderSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                                ,0x1035,
                                "size_t ZSTD_compressBlock_splitBlock_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                               );
                }
              }
            }
            else {
              ZSTD_deriveSeqStoreChunk(resultSeqStore_00,origSeqStore,0,(ulong)*pUVar1);
              lVar16 = 0;
              uVar24 = 0;
              local_70 = dstCapacity;
              local_68 = dst_00;
              for (uVar29 = 0; uVar29 <= uVar23; uVar29 = uVar29 + 1) {
                sVar14 = ZSTD_countSeqStoreLiteralsBytes(resultSeqStore_00);
                psVar8 = (cctx->blockSplitCtx).currSeqStore.sequencesStart;
                lVar26 = 0;
                for (uVar15 = 0;
                    (long)(cctx->blockSplitCtx).currSeqStore.sequences - (long)psVar8 >> 3 != uVar15
                    ; uVar15 = uVar15 + 1) {
                  lVar25 = lVar26 + (ulong)psVar8[uVar15].mlBase;
                  lVar26 = lVar25 + 3;
                  if ((uVar15 == (cctx->blockSplitCtx).currSeqStore.longLengthPos) &&
                     ((cctx->blockSplitCtx).currSeqStore.longLengthType == ZSTD_llt_matchLength)) {
                    lVar26 = lVar25 + 0x10003;
                  }
                }
                sVar14 = lVar26 + sVar14;
                lVar16 = lVar16 + sVar14;
                if (uVar29 == uVar23) {
                  sVar14 = (sVar14 + sVar13) - lVar16;
                  uVar22 = uVar5;
                }
                else {
                  ZSTD_deriveSeqStoreChunk
                            (resultSeqStore,origSeqStore,(ulong)pUVar1[uVar29],
                             (ulong)(cctx->blockSplitCtx).partitions[uVar29 + 1]);
                  uVar22 = 0;
                }
                uVar15 = ZSTD_compressSeqStore_singleBlock
                                   (cctx,resultSeqStore_00,&dRep,&local_60,local_68,local_70,
                                    local_100,sVar14,uVar22,1);
                if (0xffffffffffffff88 < uVar15) goto LAB_00627c30;
                psVar27 = resultSeqStore;
                psVar28 = resultSeqStore_00;
                for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
                  psVar28->sequencesStart = psVar27->sequencesStart;
                  psVar27 = (seqStore_t *)((long)psVar27 + (ulong)bVar32 * -0x10 + 8);
                  psVar28 = (seqStore_t *)((long)psVar28 + (ulong)bVar32 * -0x10 + 8);
                }
                if (cctx->blockSize + 3 < uVar15) {
                  __assert_fail("cSizeChunk <= zc->blockSize + ZSTD_blockHeaderSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                                ,0x1057,
                                "size_t ZSTD_compressBlock_splitBlock_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                               );
                }
                uVar24 = uVar24 + uVar15;
                local_70 = local_70 - uVar15;
                local_68 = (short *)((long)local_68 + uVar15);
                local_100 = local_100 + sVar14;
              }
              pZVar7 = (cctx->blockState).prevCBlock;
              pZVar7->rep[2] = dRep.rep[2];
              *(undefined8 *)pZVar7->rep = dRep.rep._0_8_;
              uVar15 = uVar24;
            }
          }
LAB_00627c30:
          if (0xffffffffffffff88 < uVar15) {
            return uVar15;
          }
          if (uVar15 == 0) {
            if ((cctx->seqCollector).collectSequences != 1) {
              __assert_fail("cSize > 0 || cctx->seqCollector.collectSequences == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                            ,0x1155,
                            "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                           );
            }
            uVar15 = 0;
          }
        }
        else {
          if (ZVar6 == ZSTD_ps_auto) {
            __assert_fail("cctxParams->useBlockSplitter != ZSTD_ps_auto",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0xa7a,"int ZSTD_blockSplitterEnabled(ZSTD_CCtx_params *)");
          }
          sVar14 = ZSTD_compressBlock_internal
                             (cctx,(void *)((long)dst_00 + 3),dstCapacity - 3,local_100,sVar13,1);
          if (0xffffffffffffff88 < sVar14) {
            return sVar14;
          }
          uVar17 = 2;
          uVar23 = sVar13;
          if (sVar14 != 1) {
            if (sVar14 == 0) {
              uVar15 = sVar13 + 3;
              if (dstCapacity < uVar15) {
                return 0xffffffffffffffba;
              }
              *dst_00 = uVar9 + sVar10 * 8;
              *(char *)(dst_00 + 1) = (char)(sVar13 >> 0xd);
              memcpy((void *)((long)dst_00 + 3),local_100,sVar13);
              if (0xffffffffffffff88 < uVar15) {
                return uVar15;
              }
              goto LAB_006276e8;
            }
            uVar17 = 4;
            uVar23 = sVar14;
          }
          *dst_00 = (uVar17 | uVar9) + (short)uVar23 * 8;
          *(char *)(dst_00 + 1) = (char)(uVar23 >> 0xd);
          uVar15 = sVar14 + 3;
        }
      }
      else {
        sVar14 = ZSTD_buildSeqStore(cctx,local_100,sVar13);
        if (0xffffffffffffff88 < sVar14) {
          return sVar14;
        }
        if (sVar14 == 0) {
          if (((cctx->isFirstBlock != 0) || (iVar12 = ZSTD_maybeRLE(origSeqStore), iVar12 == 0)) ||
             (iVar12 = ZSTD_isRLE(local_100,sVar13), iVar12 == 0)) {
            uVar15 = ZSTD_compressSuperBlock(cctx,dst_00,dstCapacity,local_100,sVar13,uVar5);
            if (uVar15 != 0xffffffffffffffba) {
              sVar14 = ZSTD_minGain(sVar13,(cctx->appliedParams).cParams.strategy);
              if (0xffffffffffffff88 < uVar15) {
                return uVar15;
              }
              if ((uVar15 != 0) && (uVar15 < (sVar13 - sVar14) + 3)) {
                uVar2 = (cctx->blockState).prevCBlock;
                uVar3 = (cctx->blockState).nextCBlock;
                auVar33._8_4_ = (int)uVar2;
                auVar33._0_8_ = uVar3;
                auVar33._12_4_ = (int)((ulong)uVar2 >> 0x20);
                (cctx->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar3;
                (cctx->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar33._8_8_;
                goto LAB_006276b7;
              }
            }
            goto LAB_00627672;
          }
          BVar4 = *local_100;
          *dst_00 = uVar9 + sVar10 * 8 + 2;
          *(char *)(dst_00 + 1) = (char)(sVar13 >> 0xd);
          *(BYTE *)((long)dst_00 + 3) = BVar4;
          uVar15 = 4;
        }
        else {
LAB_00627672:
          uVar15 = sVar13 + 3;
          if (dstCapacity < uVar15) {
            return 0xffffffffffffffba;
          }
          *dst_00 = uVar9 + sVar10 * 8;
          *(char *)(dst_00 + 1) = (char)(sVar13 >> 0xd);
          memcpy((void *)((long)dst_00 + 3),local_100,sVar13);
          if (0xffffffffffffff88 < uVar15) {
            return uVar15;
          }
        }
LAB_006276b7:
        pZVar7 = (cctx->blockState).prevCBlock;
        if ((pZVar7->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
          (pZVar7->entropy).fse.offcode_repeatMode = FSE_repeat_check;
        }
        if (uVar15 == 0) {
          __assert_fail("cSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0x1150,
                        "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                       );
        }
        if (sVar13 + 3 < uVar15) {
          __assert_fail("cSize <= blockSize + ZSTD_blockHeaderSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0x1151,
                        "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                       );
        }
      }
LAB_006276e8:
      bVar31 = dstCapacity < uVar15;
      dstCapacity = dstCapacity - uVar15;
      if (bVar31) {
        __assert_fail("dstCapacity >= cSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x116d,
                      "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                     );
      }
      dst_00 = (short *)((long)dst_00 + uVar15);
      cctx->isFirstBlock = 0;
      local_100 = local_38;
    }
    if ((lastFrameChunk != 0) && (dst < dst_00)) {
      cctx->stage = ZSTDcs_ending;
    }
    uVar23 = (long)dst_00 - (long)dst;
    sVar13 = local_50;
  }
  if (uVar23 < 0xffffffffffffff89) {
    uVar30 = srcSize + cctx->consumedSrcSize;
    cctx->consumedSrcSize = uVar30;
    uVar23 = uVar23 + sVar13;
    cctx->producedCSize = cctx->producedCSize + uVar23;
    uVar15 = cctx->pledgedSrcSizePlusOne;
    if (uVar15 == 0 && (cctx->appliedParams).fParams.contentSizeFlag != 0) {
      __assert_fail("!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x120b,
                    "size_t ZSTD_compressContinue_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                   );
    }
    sVar13 = 0xffffffffffffffb8;
    if (uVar30 + 1 <= uVar15) {
      sVar13 = uVar23;
    }
    if (uVar15 != 0) {
      uVar23 = sVar13;
    }
  }
  return uVar23;
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* const ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (unsigned)srcSize);
    RETURN_ERROR_IF(cctx->stage==ZSTDcs_created, stage_wrong,
                    "missing init (ZSTD_compressBegin)");

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, &cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        FORWARD_IF_ERROR(fhSize, "ZSTD_writeFrameHeader failed");
        assert(fhSize <= dstCapacity);
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize, ms->forceNonContiguous)) {
        ms->forceNonContiguous = 0;
        ms->nextToUpdate = ms->window.dictLimit;
    }
    if (cctx->appliedParams.ldmParams.enableLdm == ZSTD_ps_enable) {
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize, /* forceNonContiguous */ 0);
    }

    if (!frame) {
        /* overflow check and correction for block mode */
        ZSTD_overflowCorrectIfNeeded(
            ms, &cctx->workspace, &cctx->appliedParams,
            src, (BYTE const*)src + srcSize);
    }

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (unsigned)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize, 0 /* frame */);
        FORWARD_IF_ERROR(cSize, "%s", frame ? "ZSTD_compress_frameChunk failed" : "ZSTD_compressBlock_internal failed");
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            RETURN_ERROR_IF(
                cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne,
                srcSize_wrong,
                "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                (unsigned)cctx->pledgedSrcSizePlusOne-1,
                (unsigned)cctx->consumedSrcSize);
        }
        return cSize + fhSize;
    }
}